

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::getRawDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  int iVar1;
  ushort uVar2;
  UChar UVar3;
  undefined2 uVar4;
  uint16_t *puVar5;
  long lVar6;
  uint16_t uVar7;
  int iVar8;
  UChar *pUVar9;
  short sVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  
  if ((int)(uint)(ushort)this->minDecompNoCP <= c) {
    uVar7 = getNorm16(this,c);
    pUVar9 = (UChar *)0x0;
    if ((this->minYesNo <= uVar7) && (uVar7 < this->minMaybeYes)) {
      pUVar9 = buffer;
      if ((this->minYesNo == uVar7) || (uVar4 = this->minYesNoMappingsOnly, (uVar4 | 1) == uVar7)) {
        iVar1 = c + -0xac00;
        iVar8 = (int)((ulong)((long)iVar1 * -0x6db6db6d) >> 0x20) + c + -0xac00;
        iVar8 = (iVar8 >> 4) - (iVar8 >> 0x1f);
        iVar12 = iVar1 + iVar8 * -0x1c;
        if (iVar12 == 0) {
          *buffer = ((short)((ulong)((long)iVar1 * 0x6f74ae27) >> 0x28) - (short)(iVar1 >> 0x1f)) +
                    L'ᄀ';
          iVar12 = iVar8 % 0x15;
          sVar10 = 0x1161;
        }
        else {
          *buffer = (short)c - (short)iVar12;
          sVar10 = 0x11a7;
        }
        buffer[1] = sVar10 + (short)iVar12;
        *length = 2;
      }
      else if (uVar7 < this->limitNoNo) {
        puVar5 = this->extraData;
        uVar11 = (ulong)(uVar7 & 0xfffe);
        uVar2 = *(ushort *)((long)puVar5 + uVar11);
        uVar13 = uVar2 & 0x1f;
        if ((uVar2 & 0x40) == 0) {
          *length = uVar13;
          pUVar9 = (UChar *)((long)puVar5 + uVar11 + 2);
        }
        else {
          lVar6 = uVar11 - (uVar2 >> 6 & 2);
          UVar3 = *(UChar *)((long)puVar5 + lVar6 + -2);
          if ((ushort)UVar3 < 0x20) {
            *length = (uint)(ushort)UVar3;
            pUVar9 = (UChar *)((long)puVar5 + ((lVar6 + -2) - (ulong)((uint)(ushort)UVar3 * 2)));
          }
          else {
            *buffer = UVar3;
            u_memcpy_63(buffer + 1,(UChar *)((long)puVar5 + uVar11 + 6),uVar13 - 2);
            *length = uVar13 - 1;
          }
        }
      }
      else {
        uVar13 = ((uint)(uVar7 >> 3) + c) - (uint)this->centerNoNoDelta;
        *length = 0;
        if (uVar13 < 0x10000) {
          *length = 1;
          *buffer = (UChar)uVar13;
        }
        else {
          *length = 1;
          *buffer = (short)(uVar13 >> 10) + L'ퟀ';
          *length = 2;
          buffer[1] = (UChar)uVar13 & 0x3ffU | 0xdc00;
        }
      }
    }
    return pUVar9;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *
Normalizer2Impl::getRawDecomposition(UChar32 c, UChar buffer[30], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isDecompYes(norm16=getNorm16(c))) {
        // c does not decompose
        return NULL;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        Hangul::getRawDecomposition(c, buffer);
        length=2;
        return buffer;
    } else if(isDecompNoAlgorithmic(norm16)) {
        c=mapAlgorithmic(c, norm16);
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    int32_t mLength=firstUnit&MAPPING_LENGTH_MASK;  // length of normal mapping
    if(firstUnit&MAPPING_HAS_RAW_MAPPING) {
        // Read the raw mapping from before the firstUnit and before the optional ccc/lccc word.
        // Bit 7=MAPPING_HAS_CCC_LCCC_WORD
        const uint16_t *rawMapping=mapping-((firstUnit>>7)&1)-1;
        uint16_t rm0=*rawMapping;
        if(rm0<=MAPPING_LENGTH_MASK) {
            length=rm0;
            return (const UChar *)rawMapping-rm0;
        } else {
            // Copy the normal mapping and replace its first two code units with rm0.
            buffer[0]=(UChar)rm0;
            u_memcpy(buffer+1, (const UChar *)mapping+1+2, mLength-2);
            length=mLength-1;
            return buffer;
        }
    } else {
        length=mLength;
        return (const UChar *)mapping+1;
    }
}